

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int xmlXPathRunEval(xmlXPathParserContextPtr ctxt,int toBool)

{
  xmlPatternPtr comp;
  xmlGenericErrorFunc p_Var1;
  bool bVar2;
  int iVar3;
  int iVar4;
  xmlXPathObjectPtr *ppxVar5;
  xmlGenericErrorFunc *pp_Var6;
  void **ppvVar7;
  long lVar8;
  xmlXPathStepOpPtr op;
  bool bVar9;
  xmlXPathObjectPtr resObj;
  xmlXPathObjectPtr local_28;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return -1;
  }
  local_28 = (xmlXPathObjectPtr)0xffffffff;
  if (ctxt->comp == (xmlXPathCompExprPtr)0x0) {
    return -1;
  }
  ctxt->context->depth = 0;
  if (ctxt->valueTab == (xmlXPathObjectPtr *)0x0) {
    ppxVar5 = (xmlXPathObjectPtr *)(*xmlMalloc)(0x50);
    ctxt->valueTab = ppxVar5;
    if (ppxVar5 == (xmlXPathObjectPtr *)0x0) {
      ctxt->error = 0xf;
      xmlXPathErrMemory(ctxt->context,"creating evaluation context\n");
      (*xmlFree)(ctxt);
    }
    ctxt->valueNr = 0;
    ctxt->valueMax = 10;
    ctxt->value = (xmlXPathObjectPtr)0x0;
    ctxt->valueFrame = 0;
  }
  comp = ctxt->comp->stream;
  if (comp == (xmlPatternPtr)0x0) goto LAB_001e70c5;
  if (toBool == 0) {
    local_28 = (xmlXPathObjectPtr)0x0;
    iVar4 = xmlXPathRunStreamEval(ctxt->context,comp,&local_28,0);
    bVar9 = local_28 == (xmlXPathObjectPtr)0x0;
    if (bVar9 || iVar4 == -1) {
      if (local_28 != (xmlXPathObjectPtr)0x0) {
        xmlXPathReleaseObject(ctxt->context,local_28);
      }
    }
    else {
      valuePush(ctxt,local_28);
    }
    iVar3 = 0;
    bVar2 = false;
    if (bVar9 || iVar4 == -1) goto LAB_001e70b7;
  }
  else {
    bVar2 = false;
    iVar3 = xmlXPathRunStreamEval(ctxt->context,comp,(xmlXPathObjectPtr *)0x0,1);
    if (iVar3 == -1) {
LAB_001e70b7:
      bVar2 = true;
      iVar3 = 0;
    }
  }
  if (!bVar2) {
    return iVar3;
  }
LAB_001e70c5:
  lVar8 = (long)ctxt->comp->last;
  if (lVar8 < 0) {
    pp_Var6 = __xmlGenericError();
    p_Var1 = *pp_Var6;
    ppvVar7 = __xmlGenericErrorContext();
    (*p_Var1)(*ppvVar7,"xmlXPathRunEval: last is less than zero\n");
    iVar4 = -1;
  }
  else {
    op = ctxt->comp->steps + lVar8;
    if (toBool == 0) {
      xmlXPathCompOpEval(ctxt,op);
      iVar4 = 0;
    }
    else {
      iVar4 = xmlXPathCompOpEvalToBoolean(ctxt,op,0);
    }
  }
  return iVar4;
}

Assistant:

static int
xmlXPathRunEval(xmlXPathParserContextPtr ctxt, int toBool)
{
    xmlXPathCompExprPtr comp;

    if ((ctxt == NULL) || (ctxt->comp == NULL))
	return(-1);

    ctxt->context->depth = 0;

    if (ctxt->valueTab == NULL) {
	/* Allocate the value stack */
	ctxt->valueTab = (xmlXPathObjectPtr *)
			 xmlMalloc(10 * sizeof(xmlXPathObjectPtr));
	if (ctxt->valueTab == NULL) {
	    xmlXPathPErrMemory(ctxt, "creating evaluation context\n");
	    xmlFree(ctxt);
	}
	ctxt->valueNr = 0;
	ctxt->valueMax = 10;
	ctxt->value = NULL;
        ctxt->valueFrame = 0;
    }
#ifdef XPATH_STREAMING
    if (ctxt->comp->stream) {
	int res;

	if (toBool) {
	    /*
	    * Evaluation to boolean result.
	    */
	    res = xmlXPathRunStreamEval(ctxt->context,
		ctxt->comp->stream, NULL, 1);
	    if (res != -1)
		return(res);
	} else {
	    xmlXPathObjectPtr resObj = NULL;

	    /*
	    * Evaluation to a sequence.
	    */
	    res = xmlXPathRunStreamEval(ctxt->context,
		ctxt->comp->stream, &resObj, 0);

	    if ((res != -1) && (resObj != NULL)) {
		valuePush(ctxt, resObj);
		return(0);
	    }
	    if (resObj != NULL)
		xmlXPathReleaseObject(ctxt->context, resObj);
	}
	/*
	* QUESTION TODO: This falls back to normal XPath evaluation
	* if res == -1. Is this intended?
	*/
    }
#endif
    comp = ctxt->comp;
    if (comp->last < 0) {
	xmlGenericError(xmlGenericErrorContext,
	    "xmlXPathRunEval: last is less than zero\n");
	return(-1);
    }
    if (toBool)
	return(xmlXPathCompOpEvalToBoolean(ctxt,
	    &comp->steps[comp->last], 0));
    else
	xmlXPathCompOpEval(ctxt, &comp->steps[comp->last]);

    return(0);
}